

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SocketTest.cpp
# Opt level: O0

void __thiscall
jaegertracing::net::Socket_testFailConnect_Test::TestBody(Socket_testFailConnect_Test *this)

{
  bool bVar1;
  byte bVar2;
  socklen_t in_ECX;
  sockaddr *__addr;
  AssertHelper local_108 [8];
  Message local_100 [16];
  runtime_error *anon_var_0;
  string local_e8;
  IPAddress local_c8;
  byte local_39;
  char *pcStack_38;
  bool gtest_caught_expected;
  ConstCharPtr gtest_msg;
  undefined1 local_20 [8];
  Socket socket;
  Socket_testFailConnect_Test *this_local;
  
  socket._8_8_ = this;
  Socket::Socket((Socket *)local_20);
  Socket::open((Socket *)local_20,(char *)0x2,1);
  testing::internal::ConstCharPtr::ConstCharPtr((ConstCharPtr *)&stack0xffffffffffffffc8,"");
  bVar1 = testing::internal::ConstCharPtr::operator_cast_to_bool
                    ((ConstCharPtr *)&stack0xffffffffffffffc8);
  if (bVar1) {
    local_39 = 0;
    bVar2 = testing::internal::AlwaysTrue();
    if ((bVar2 & 1) != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_e8,"127.0.0.1",(allocator *)((long)&anon_var_0 + 7));
      IPAddress::v4(&local_c8,&local_e8,0x3039);
      Socket::connect((Socket *)local_20,(int)&local_c8,__addr,in_ECX);
      std::__cxx11::string::~string((string *)&local_e8);
      std::allocator<char>::~allocator((allocator<char> *)((long)&anon_var_0 + 7));
    }
    if ((local_39 & 1) != 0) {
      anon_var_0._0_4_ = 0;
      goto LAB_002bcda4;
    }
    pcStack_38 = 
    "Expected: socket.connect(IPAddress::v4(\"127.0.0.1\", 12345)) throws an exception of type std::runtime_error.\n  Actual: it throws nothing."
    ;
  }
  testing::Message::Message(local_100);
  testing::internal::AssertHelper::AssertHelper
            (local_108,kFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/net/SocketTest.cpp"
             ,0x30,pcStack_38);
  testing::internal::AssertHelper::operator=(local_108,local_100);
  testing::internal::AssertHelper::~AssertHelper(local_108);
  testing::Message::~Message(local_100);
  anon_var_0._0_4_ = 1;
LAB_002bcda4:
  Socket::~Socket((Socket *)local_20);
  return;
}

Assistant:

TEST(Socket, testFailConnect)
{
    Socket socket;
    socket.open(AF_INET, SOCK_STREAM);
    ASSERT_THROW(socket.connect(IPAddress::v4("127.0.0.1", 12345)),
                 std::runtime_error);
}